

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O3

bool embree::sse2::InstanceIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  float *pfVar1;
  float (*pafVar2) [16];
  float *pfVar3;
  float *pfVar4;
  Instance *pIVar5;
  RTCPointQueryContext *pRVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  undefined1 uVar13;
  uint uVar14;
  AffineSpace3ff *pAVar15;
  AffineSpace3ff *pAVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  vfloat4 l02;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar27;
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar39 [12];
  float fVar38;
  vfloat4 a0;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar45;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [16];
  uint uVar46;
  undefined1 auVar44 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar59;
  float fVar61;
  undefined1 auVar60 [12];
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [12];
  undefined1 auVar69 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float local_1c8;
  undefined8 local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  long local_98;
  undefined8 local_90;
  PointQuery *local_88;
  undefined4 local_80;
  PointQueryFunction local_78;
  RTCPointQueryContext *local_70;
  float local_68;
  void *local_60;
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar5 = prim->instance;
  if ((pIVar5->super_Geometry).numTimeSteps == 1) {
    pAVar15 = pIVar5->local2world;
    if ((pIVar5->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar17 = (pAVar15->p).field_0.m128[3];
      fVar18 = (pAVar15->l).vx.field_0.m128[3];
      fVar19 = (pAVar15->l).vy.field_0.m128[3];
      fVar20 = (pAVar15->l).vz.field_0.m128[3];
      fVar27 = (pAVar15->l).vy.field_0.m128[0];
      fVar28 = (pAVar15->l).vy.field_0.m128[1];
      fVar35 = fVar18 * fVar19 + fVar17 * fVar20;
      fVar40 = fVar18 * fVar19 - fVar17 * fVar20;
      fVar45 = fVar17 * fVar17 + fVar18 * fVar18 + -fVar19 * fVar19 + -fVar20 * fVar20;
      fVar29 = fVar17 * fVar17 - fVar18 * fVar18;
      fVar34 = fVar19 * fVar19 + fVar29 + -fVar20 * fVar20;
      fVar37 = fVar18 * fVar20 - fVar17 * fVar19;
      fVar47 = fVar17 * fVar19 + fVar18 * fVar20;
      fVar36 = fVar19 * fVar20 + fVar17 * fVar18;
      fVar23 = fVar19 * fVar20 - fVar17 * fVar18;
      fVar35 = fVar35 + fVar35;
      fVar37 = fVar37 + fVar37;
      fVar29 = fVar20 * fVar20 + fVar29 + -fVar19 * fVar19;
      fVar62 = fVar45 * 1.0 + fVar35 * 0.0 + fVar37 * 0.0;
      fVar63 = fVar45 * 0.0 + fVar35 * 1.0 + fVar37 * 0.0;
      fVar51 = fVar45 * 0.0 + fVar35 * 0.0 + fVar37 * 1.0;
      fVar41 = fVar45 * 0.0 + fVar35 * 0.0 + fVar37 * 0.0;
      fVar36 = fVar36 + fVar36;
      fVar40 = fVar40 + fVar40;
      fVar20 = fVar40 * 1.0 + fVar34 * 0.0 + fVar36 * 0.0;
      fVar57 = fVar40 * 0.0 + fVar34 * 1.0 + fVar36 * 0.0;
      fVar58 = fVar40 * 0.0 + fVar34 * 0.0 + fVar36 * 1.0;
      fVar61 = fVar40 * 0.0 + fVar34 * 0.0 + fVar36 * 0.0;
      local_1c8 = SUB124(*(undefined1 (*) [12])&(pAVar15->l).vx.field_0,0);
      fVar17 = (pAVar15->l).vz.field_0.m128[0];
      fVar18 = (pAVar15->l).vz.field_0.m128[1];
      fVar19 = (pAVar15->l).vz.field_0.m128[2];
      fVar50 = (pAVar15->p).field_0.m128[0];
      fVar55 = (pAVar15->p).field_0.m128[1];
      fVar56 = (pAVar15->p).field_0.m128[2];
      fVar47 = fVar47 + fVar47;
      fVar23 = fVar23 + fVar23;
      fVar59 = fVar47 * 1.0 + fVar23 * 0.0 + fVar29 * 0.0;
      fVar42 = fVar47 * 0.0 + fVar23 * 1.0 + fVar29 * 0.0;
      fVar66 = fVar47 * 0.0 + fVar23 * 0.0 + fVar29 * 1.0;
      fVar33 = fVar47 * 0.0 + fVar23 * 0.0 + fVar29 * 0.0;
      fVar40 = local_1c8 * fVar62 + fVar20 * 0.0 + fVar59 * 0.0;
      fVar45 = local_1c8 * fVar63 + fVar57 * 0.0 + fVar42 * 0.0;
      fVar47 = local_1c8 * fVar51 + fVar58 * 0.0 + fVar66 * 0.0;
      fVar23 = local_1c8 * fVar41 + fVar61 * 0.0 + fVar33 * 0.0;
      fVar35 = fVar27 * fVar62 + fVar28 * fVar20 + fVar59 * 0.0;
      fVar36 = fVar27 * fVar63 + fVar28 * fVar57 + fVar42 * 0.0;
      fVar37 = fVar27 * fVar51 + fVar28 * fVar58 + fVar66 * 0.0;
      fVar48 = fVar27 * fVar41 + fVar28 * fVar61 + fVar33 * 0.0;
      fVar27 = fVar17 * fVar62 + fVar18 * fVar20 + fVar19 * fVar59;
      fVar28 = fVar17 * fVar63 + fVar18 * fVar57 + fVar19 * fVar42;
      fVar29 = fVar17 * fVar51 + fVar18 * fVar58 + fVar19 * fVar66;
      fVar34 = fVar17 * fVar41 + fVar18 * fVar61 + fVar19 * fVar33;
      fVar17 = fVar50 * fVar62 + fVar55 * fVar20 + fVar56 * fVar59 +
               (pAVar15->l).vx.field_0.m128[1] + 0.0;
      fVar18 = fVar50 * fVar63 + fVar55 * fVar57 + fVar56 * fVar42 +
               (pAVar15->l).vx.field_0.m128[2] + 0.0;
      fVar20 = fVar50 * fVar51 + fVar55 * fVar58 + fVar56 * fVar66 +
               (pAVar15->l).vy.field_0.m128[2] + 0.0;
      fVar19 = fVar50 * fVar41 + fVar55 * fVar61 + fVar56 * fVar33 + 0.0;
    }
    else {
      fVar40 = (pAVar15->l).vx.field_0.m128[0];
      fVar45 = (pAVar15->l).vx.field_0.m128[1];
      fVar47 = (pAVar15->l).vx.field_0.m128[2];
      fVar23 = (pAVar15->l).vx.field_0.m128[3];
      fVar35 = (pAVar15->l).vy.field_0.m128[0];
      fVar36 = (pAVar15->l).vy.field_0.m128[1];
      fVar37 = (pAVar15->l).vy.field_0.m128[2];
      fVar48 = (pAVar15->l).vy.field_0.m128[3];
      fVar27 = (pAVar15->l).vz.field_0.m128[0];
      fVar28 = (pAVar15->l).vz.field_0.m128[1];
      fVar29 = (pAVar15->l).vz.field_0.m128[2];
      fVar34 = (pAVar15->l).vz.field_0.m128[3];
      fVar17 = (pAVar15->p).field_0.m128[0];
      fVar18 = (pAVar15->p).field_0.m128[1];
      fVar20 = (pAVar15->p).field_0.m128[2];
      fVar19 = (pAVar15->p).field_0.m128[3];
    }
  }
  else {
    fVar17 = (pIVar5->super_Geometry).fnumTimeSegments;
    fVar18 = (pIVar5->super_Geometry).time_range.lower;
    fVar19 = ((query->time - fVar18) / ((pIVar5->super_Geometry).time_range.upper - fVar18)) *
             fVar17;
    fVar18 = floorf(fVar19);
    fVar17 = fVar17 + -1.0;
    if (fVar17 <= fVar18) {
      fVar18 = fVar17;
    }
    fVar17 = 0.0;
    if (0.0 <= fVar18) {
      fVar17 = fVar18;
    }
    fVar19 = fVar19 - fVar17;
    pAVar15 = pIVar5->local2world + (uint)(int)fVar17;
    pAVar16 = pIVar5->local2world + ((int)fVar17 + 1);
    if ((pIVar5->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar17 = (pAVar15->p).field_0.m128[3];
      fVar18 = (pAVar15->l).vx.field_0.m128[3];
      fVar20 = (pAVar15->l).vy.field_0.m128[3];
      fVar40 = (pAVar15->l).vz.field_0.m128[3];
      fVar45 = (pAVar16->p).field_0.m128[3];
      fVar47 = (pAVar16->l).vx.field_0.m128[3];
      fVar23 = (pAVar16->l).vy.field_0.m128[3];
      fVar27 = (pAVar16->l).vz.field_0.m128[3];
      fVar29 = fVar40 * fVar27 + fVar20 * fVar23 + fVar17 * fVar45 + fVar18 * fVar47;
      fVar28 = -fVar29;
      if (fVar29 < fVar28) {
        fVar27 = -fVar27;
      }
      fVar35 = ABS(fVar29);
      fVar34 = fVar28;
      if (fVar28 <= fVar29) {
        fVar34 = fVar29;
      }
      fVar36 = 1.0 - fVar35;
      if (fVar36 < 0.0) {
        fVar36 = sqrtf(fVar36);
      }
      else {
        fVar36 = SQRT(fVar36);
      }
      fVar23 = (float)(~-(uint)(fVar29 < fVar28) & (uint)fVar23 |
                      (uint)-fVar23 & -(uint)(fVar29 < fVar28));
      fVar36 = 1.5707964 -
               fVar36 * (((((fVar35 * -0.0043095737 + 0.0192803) * fVar35 + -0.04489909) * fVar35 +
                          0.08785567) * fVar35 + -0.21450998) * fVar35 + 1.5707952);
      fVar28 = 0.0;
      if (0.0 <= fVar36) {
        fVar28 = fVar36;
      }
      fVar37 = (float)(-(uint)(1.0 < fVar35) & 0x7fc00000 |
                      ~-(uint)(1.0 < fVar35) &
                      (uint)(1.5707964 -
                            (float)((uint)-fVar28 & -(uint)(fVar34 < 0.0) |
                                   ~-(uint)(fVar34 < 0.0) & (uint)fVar28))) * fVar19;
      fVar36 = floorf(fVar37 * 0.63661975);
      fVar37 = fVar37 - fVar36 * 1.5707964;
      fVar28 = fVar37 * fVar37;
      uVar14 = (int)fVar36 & 3;
      fVar35 = ((((fVar28 * -2.5963018e-07 + 2.4756235e-05) * fVar28 + -0.001388833) * fVar28 +
                0.04166664) * fVar28 + -0.5) * fVar28 + 1.0;
      fVar37 = (((((fVar28 * -2.5029328e-08 + 2.7600126e-06) * fVar28 + -0.00019842605) * fVar28 +
                 0.008333348) * fVar28 + -0.16666667) * fVar28 + 1.0) * fVar37;
      fVar28 = fVar37;
      if (((int)fVar36 & 1U) != 0) {
        fVar28 = fVar35;
        fVar35 = fVar37;
      }
      if (uVar14 - 1 < 2) {
        fVar35 = -fVar35;
      }
      fVar37 = fVar34 * fVar20 - fVar23;
      fVar36 = fVar34 * fVar40 - fVar27;
      if (uVar14 < 2) {
        fVar28 = -fVar28;
      }
      fVar55 = 1.0 - fVar19;
      fVar23 = fVar55 * fVar20 + fVar23 * fVar19;
      fVar27 = fVar55 * fVar40 + fVar27 * fVar19;
      uVar14 = (int)((uint)(fVar29 < 0.0) << 0x1f) >> 0x1f;
      uVar46 = (int)((uint)(fVar29 < 0.0) << 0x1f) >> 0x1f;
      fVar29 = (float)((uint)-fVar45 & uVar14 | ~uVar14 & (uint)fVar45);
      fVar50 = (float)((uint)-fVar47 & uVar46 | ~uVar46 & (uint)fVar47);
      fVar47 = fVar34 * fVar17 - fVar29;
      fVar48 = fVar34 * fVar18 - fVar50;
      auVar32._4_4_ = 0x80000000;
      auVar32._0_4_ = fVar36;
      auVar32._8_4_ = 0x80000000;
      auVar32._12_4_ = 0x80000000;
      auVar25._4_12_ = auVar32._4_12_;
      auVar25._0_4_ = fVar36 * fVar36 + fVar37 * fVar37 + fVar47 * fVar47 + fVar48 * fVar48;
      auVar31._4_4_ = 0x80000000;
      auVar31._0_4_ = auVar25._0_4_;
      auVar31._8_4_ = 0x80000000;
      auVar31._12_4_ = 0x80000000;
      auVar31 = rsqrtss(auVar31,auVar25);
      fVar45 = auVar31._0_4_;
      fVar45 = fVar45 * fVar45 * auVar25._0_4_ * -0.5 * fVar45 + fVar45 * 1.5;
      fVar56 = fVar17 * fVar55 + fVar29 * fVar19;
      fVar57 = fVar18 * fVar55 + fVar50 * fVar19;
      fVar50 = fVar27 * fVar27 + fVar23 * fVar23 + fVar56 * fVar56 + fVar57 * fVar57;
      auVar31 = rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
      fVar29 = auVar31._0_4_;
      fVar29 = fVar29 * fVar29 * fVar50 * -0.5 * fVar29 + fVar29 * 1.5;
      uVar14 = (int)((uint)(0.9995 < fVar34) << 0x1f) >> 0x1f;
      uVar46 = (int)((uint)(0.9995 < fVar34) << 0x1f) >> 0x1f;
      fVar17 = (float)(~uVar14 & (uint)(fVar35 * fVar17 + fVar28 * fVar45 * fVar47) |
                      (uint)(fVar29 * fVar56) & uVar14);
      fVar18 = (float)(~uVar46 & (uint)(fVar35 * fVar18 + fVar28 * fVar45 * fVar48) |
                      (uint)(fVar29 * fVar57) & uVar46);
      if (0.9995 < fVar34) {
        fVar23 = fVar23 * fVar29;
        fVar27 = fVar27 * fVar29;
      }
      else {
        fVar23 = fVar20 * fVar35 + fVar37 * fVar45 * fVar28;
        fVar27 = fVar40 * fVar35 + fVar36 * fVar45 * fVar28;
      }
      fVar29 = (pAVar15->l).vx.field_0.m128[0] * fVar55 + (pAVar16->l).vx.field_0.m128[0] * fVar19;
      fVar20 = (pAVar15->l).vy.field_0.m128[0] * fVar55 + (pAVar16->l).vy.field_0.m128[0] * fVar19;
      fVar28 = (pAVar15->l).vy.field_0.m128[1] * fVar55 + (pAVar16->l).vy.field_0.m128[1] * fVar19;
      fVar34 = (pAVar15->l).vz.field_0.m128[0] * fVar55 + (pAVar16->l).vz.field_0.m128[0] * fVar19;
      fVar50 = (pAVar15->l).vz.field_0.m128[1] * fVar55 + (pAVar16->l).vz.field_0.m128[1] * fVar19;
      fVar56 = (pAVar15->l).vz.field_0.m128[2] * fVar55 + (pAVar16->l).vz.field_0.m128[2] * fVar19;
      fVar49 = fVar55 * (pAVar15->p).field_0.m128[0] + fVar19 * (pAVar16->p).field_0.m128[0];
      fVar67 = fVar55 * (pAVar15->p).field_0.m128[1] + fVar19 * (pAVar16->p).field_0.m128[1];
      fVar70 = fVar55 * (pAVar15->p).field_0.m128[2] + fVar19 * (pAVar16->p).field_0.m128[2];
      fVar35 = fVar18 * fVar23 + fVar17 * fVar27;
      fVar40 = fVar18 * fVar23 - fVar17 * fVar27;
      fVar37 = fVar17 * fVar17 - fVar18 * fVar18;
      fVar45 = fVar17 * fVar17 + fVar18 * fVar18 + -fVar23 * fVar23 + -fVar27 * fVar27;
      fVar36 = fVar23 * fVar23 + fVar37 + -fVar27 * fVar27;
      fVar57 = fVar18 * fVar27 - fVar17 * fVar23;
      fVar47 = fVar17 * fVar23 + fVar18 * fVar27;
      fVar48 = fVar23 * fVar27 + fVar17 * fVar18;
      fVar17 = fVar23 * fVar27 - fVar17 * fVar18;
      fVar35 = fVar35 + fVar35;
      fVar57 = fVar57 + fVar57;
      fVar18 = fVar27 * fVar27 + fVar37 + -fVar23 * fVar23;
      fVar63 = fVar45 * 1.0 + fVar35 * 0.0 + fVar57 * 0.0;
      fVar51 = fVar45 * 0.0 + fVar35 * 1.0 + fVar57 * 0.0;
      fVar41 = fVar45 * 0.0 + fVar35 * 0.0 + fVar57 * 1.0;
      fVar59 = fVar45 * 0.0 + fVar35 * 0.0 + fVar57 * 0.0;
      fVar48 = fVar48 + fVar48;
      fVar40 = fVar40 + fVar40;
      fVar57 = fVar40 * 1.0 + fVar36 * 0.0 + fVar48 * 0.0;
      fVar58 = fVar40 * 0.0 + fVar36 * 1.0 + fVar48 * 0.0;
      fVar61 = fVar40 * 0.0 + fVar36 * 0.0 + fVar48 * 1.0;
      fVar62 = fVar40 * 0.0 + fVar36 * 0.0 + fVar48 * 0.0;
      fVar47 = fVar47 + fVar47;
      fVar17 = fVar17 + fVar17;
      fVar42 = fVar47 * 1.0 + fVar17 * 0.0 + fVar18 * 0.0;
      fVar66 = fVar47 * 0.0 + fVar17 * 1.0 + fVar18 * 0.0;
      fVar33 = fVar47 * 0.0 + fVar17 * 0.0 + fVar18 * 1.0;
      fVar38 = fVar47 * 0.0 + fVar17 * 0.0 + fVar18 * 0.0;
      fVar40 = fVar29 * fVar63 + fVar57 * 0.0 + fVar42 * 0.0;
      fVar45 = fVar29 * fVar51 + fVar58 * 0.0 + fVar66 * 0.0;
      fVar47 = fVar29 * fVar41 + fVar61 * 0.0 + fVar33 * 0.0;
      fVar23 = fVar29 * fVar59 + fVar62 * 0.0 + fVar38 * 0.0;
      fVar35 = fVar20 * fVar63 + fVar28 * fVar57 + fVar42 * 0.0;
      fVar36 = fVar20 * fVar51 + fVar28 * fVar58 + fVar66 * 0.0;
      fVar37 = fVar20 * fVar41 + fVar28 * fVar61 + fVar33 * 0.0;
      fVar48 = fVar20 * fVar59 + fVar28 * fVar62 + fVar38 * 0.0;
      fVar27 = fVar34 * fVar63 + fVar50 * fVar57 + fVar56 * fVar42;
      fVar28 = fVar34 * fVar51 + fVar50 * fVar58 + fVar56 * fVar66;
      fVar29 = fVar34 * fVar41 + fVar50 * fVar61 + fVar56 * fVar33;
      fVar34 = fVar34 * fVar59 + fVar50 * fVar62 + fVar56 * fVar38;
      fVar17 = fVar49 * fVar63 + fVar67 * fVar57 + fVar70 * fVar42 +
               (pAVar15->l).vx.field_0.m128[1] * fVar55 + (pAVar16->l).vx.field_0.m128[1] * fVar19 +
               0.0;
      fVar18 = fVar49 * fVar51 + fVar67 * fVar58 + fVar70 * fVar66 +
               (pAVar15->l).vx.field_0.m128[2] * fVar55 + (pAVar16->l).vx.field_0.m128[2] * fVar19 +
               0.0;
      fVar20 = fVar49 * fVar41 + fVar67 * fVar61 + fVar70 * fVar33 +
               (pAVar15->l).vy.field_0.m128[2] * fVar55 + (pAVar16->l).vy.field_0.m128[2] * fVar19 +
               0.0;
      fVar19 = fVar49 * fVar59 + fVar67 * fVar62 + fVar70 * fVar38 + 0.0;
    }
    else {
      fVar50 = 1.0 - fVar19;
      fVar40 = (pAVar15->l).vx.field_0.m128[0] * fVar50 + (pAVar16->l).vx.field_0.m128[0] * fVar19;
      fVar45 = (pAVar15->l).vx.field_0.m128[1] * fVar50 + (pAVar16->l).vx.field_0.m128[1] * fVar19;
      fVar47 = (pAVar15->l).vx.field_0.m128[2] * fVar50 + (pAVar16->l).vx.field_0.m128[2] * fVar19;
      fVar23 = (pAVar15->l).vx.field_0.m128[3] * fVar50 + (pAVar16->l).vx.field_0.m128[3] * fVar19;
      fVar35 = (pAVar15->l).vy.field_0.m128[0] * fVar50 + (pAVar16->l).vy.field_0.m128[0] * fVar19;
      fVar36 = (pAVar15->l).vy.field_0.m128[1] * fVar50 + (pAVar16->l).vy.field_0.m128[1] * fVar19;
      fVar37 = (pAVar15->l).vy.field_0.m128[2] * fVar50 + (pAVar16->l).vy.field_0.m128[2] * fVar19;
      fVar48 = (pAVar15->l).vy.field_0.m128[3] * fVar50 + (pAVar16->l).vy.field_0.m128[3] * fVar19;
      fVar27 = (pAVar15->l).vz.field_0.m128[0] * fVar50 + (pAVar16->l).vz.field_0.m128[0] * fVar19;
      fVar28 = (pAVar15->l).vz.field_0.m128[1] * fVar50 + (pAVar16->l).vz.field_0.m128[1] * fVar19;
      fVar29 = (pAVar15->l).vz.field_0.m128[2] * fVar50 + (pAVar16->l).vz.field_0.m128[2] * fVar19;
      fVar34 = (pAVar15->l).vz.field_0.m128[3] * fVar50 + (pAVar16->l).vz.field_0.m128[3] * fVar19;
      fVar17 = fVar50 * (pAVar15->p).field_0.m128[0] + fVar19 * (pAVar16->p).field_0.m128[0];
      fVar18 = fVar50 * (pAVar15->p).field_0.m128[1] + fVar19 * (pAVar16->p).field_0.m128[1];
      fVar20 = fVar50 * (pAVar15->p).field_0.m128[2] + fVar19 * (pAVar16->p).field_0.m128[2];
      fVar19 = fVar50 * (pAVar15->p).field_0.m128[3] + fVar19 * (pAVar16->p).field_0.m128[3];
    }
  }
  if ((pIVar5->super_Geometry).numTimeSteps == 1) {
    auVar31 = *(undefined1 (*) [16])(pIVar5->world2local0).l.vx.field_0.m128;
    auVar32 = *(undefined1 (*) [16])(pIVar5->world2local0).l.vy.field_0.m128;
    auVar25 = *(undefined1 (*) [16])(pIVar5->world2local0).l.vz.field_0.m128;
    fVar50 = (pIVar5->world2local0).p.field_0.m128[0];
    fVar55 = (pIVar5->world2local0).p.field_0.m128[1];
    fVar56 = (pIVar5->world2local0).p.field_0.m128[2];
    fVar57 = (pIVar5->world2local0).p.field_0.m128[3];
  }
  else {
    fVar50 = (pIVar5->super_Geometry).fnumTimeSegments;
    fVar55 = (pIVar5->super_Geometry).time_range.lower;
    fVar56 = ((query->time - fVar55) / ((pIVar5->super_Geometry).time_range.upper - fVar55)) *
             fVar50;
    fVar55 = floorf(fVar56);
    fVar50 = fVar50 + -1.0;
    if (fVar50 <= fVar55) {
      fVar55 = fVar50;
    }
    fVar50 = 0.0;
    if (0.0 <= fVar55) {
      fVar50 = fVar55;
    }
    fVar56 = fVar56 - fVar50;
    pAVar15 = pIVar5->local2world + (uint)(int)fVar50;
    pAVar16 = pIVar5->local2world + ((int)fVar50 + 1);
    if ((pIVar5->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar50 = (pAVar15->p).field_0.m128[3];
      fVar55 = (pAVar15->l).vx.field_0.m128[3];
      fVar57 = (pAVar15->l).vy.field_0.m128[3];
      fVar58 = (pAVar15->l).vz.field_0.m128[3];
      fVar61 = (pAVar16->p).field_0.m128[3];
      fVar62 = (pAVar16->l).vx.field_0.m128[3];
      fVar63 = (pAVar16->l).vy.field_0.m128[3];
      fVar51 = (pAVar16->l).vz.field_0.m128[3];
      fVar59 = fVar58 * fVar51 + fVar57 * fVar63 + fVar50 * fVar61 + fVar55 * fVar62;
      fVar41 = -fVar59;
      if (fVar59 < fVar41) {
        fVar51 = -fVar51;
      }
      fVar66 = ABS(fVar59);
      fVar42 = fVar41;
      if (fVar41 <= fVar59) {
        fVar42 = fVar59;
      }
      fVar33 = 1.0 - fVar66;
      if (fVar33 < 0.0) {
        uStack_a4 = 0;
        uStack_a0 = 0;
        uStack_9c = 0;
        local_a8 = fVar66;
        fVar33 = sqrtf(fVar33);
        fVar38 = local_a8;
      }
      else {
        fVar33 = SQRT(fVar33);
        fVar38 = fVar66;
      }
      fVar63 = (float)(~-(uint)(fVar59 < fVar41) & (uint)fVar63 |
                      (uint)-fVar63 & -(uint)(fVar59 < fVar41));
      fVar66 = 1.5707964 -
               fVar33 * (((((fVar66 * -0.0043095737 + 0.0192803) * fVar66 + -0.04489909) * fVar66 +
                          0.08785567) * fVar66 + -0.21450998) * fVar66 + 1.5707952);
      fVar41 = 0.0;
      if (0.0 <= fVar66) {
        fVar41 = fVar66;
      }
      fVar41 = (float)(-(uint)(1.0 < fVar38) & 0x7fc00000 |
                      ~-(uint)(1.0 < fVar38) &
                      (uint)(1.5707964 -
                            (float)((uint)-fVar41 & -(uint)(fVar42 < 0.0) |
                                   ~-(uint)(fVar42 < 0.0) & (uint)fVar41))) * fVar56;
      fVar33 = floorf(fVar41 * 0.63661975);
      fVar41 = fVar41 - fVar33 * 1.5707964;
      fVar66 = fVar41 * fVar41;
      uVar14 = (int)fVar33 & 3;
      fVar38 = ((((fVar66 * -2.5963018e-07 + 2.4756235e-05) * fVar66 + -0.001388833) * fVar66 +
                0.04166664) * fVar66 + -0.5) * fVar66 + 1.0;
      fVar41 = (((((fVar66 * -2.5029328e-08 + 2.7600126e-06) * fVar66 + -0.00019842605) * fVar66 +
                 0.008333348) * fVar66 + -0.16666667) * fVar66 + 1.0) * fVar41;
      fVar66 = fVar38;
      if (((int)fVar33 & 1U) != 0) {
        fVar66 = fVar41;
        fVar41 = fVar38;
      }
      if (uVar14 - 1 < 2) {
        fVar66 = -fVar66;
      }
      fVar38 = fVar42 * fVar57 - fVar63;
      fVar33 = fVar42 * fVar58 - fVar51;
      if (uVar14 < 2) {
        fVar41 = -fVar41;
      }
      fVar70 = 1.0 - fVar56;
      fVar63 = fVar70 * fVar57 + fVar63 * fVar56;
      fVar51 = fVar70 * fVar58 + fVar51 * fVar56;
      uVar14 = (int)((uint)(fVar59 < 0.0) << 0x1f) >> 0x1f;
      uVar46 = (int)((uint)(fVar59 < 0.0) << 0x1f) >> 0x1f;
      fVar49 = (float)((uint)-fVar61 & uVar14 | ~uVar14 & (uint)fVar61);
      fVar67 = (float)((uint)-fVar62 & uVar46 | ~uVar46 & (uint)fVar62);
      fVar61 = fVar42 * fVar50 - fVar49;
      fVar62 = fVar42 * fVar55 - fVar67;
      auVar53._4_4_ = 0x80000000;
      auVar53._0_4_ = fVar33;
      auVar53._8_4_ = 0x80000000;
      auVar53._12_4_ = 0x80000000;
      auVar54._4_12_ = auVar53._4_12_;
      auVar54._0_4_ = fVar33 * fVar33 + fVar38 * fVar38 + fVar61 * fVar61 + fVar62 * fVar62;
      auVar44._4_4_ = 0x80000000;
      auVar44._0_4_ = auVar54._0_4_;
      auVar44._8_4_ = 0x80000000;
      auVar44._12_4_ = 0x80000000;
      auVar31 = rsqrtss(auVar44,auVar54);
      fVar59 = auVar31._0_4_;
      fVar59 = fVar59 * fVar59 * auVar54._0_4_ * -0.5 * fVar59 + fVar59 * 1.5;
      fVar73 = fVar50 * fVar70 + fVar49 * fVar56;
      fVar75 = fVar55 * fVar70 + fVar67 * fVar56;
      fVar67 = fVar51 * fVar51 + fVar63 * fVar63 + fVar73 * fVar73 + fVar75 * fVar75;
      auVar31 = rsqrtss(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
      fVar49 = auVar31._0_4_;
      fVar49 = fVar49 * fVar49 * fVar67 * -0.5 * fVar49 + fVar49 * 1.5;
      uVar14 = (int)((uint)(0.9995 < fVar42) << 0x1f) >> 0x1f;
      uVar46 = (int)((uint)(0.9995 < fVar42) << 0x1f) >> 0x1f;
      fVar50 = (float)(~uVar14 & (uint)(fVar66 * fVar50 + fVar41 * fVar59 * fVar61) |
                      (uint)(fVar49 * fVar73) & uVar14);
      fVar55 = (float)(~uVar46 & (uint)(fVar66 * fVar55 + fVar41 * fVar59 * fVar62) |
                      (uint)(fVar49 * fVar75) & uVar46);
      if (0.9995 < fVar42) {
        fVar63 = fVar63 * fVar49;
        fVar51 = fVar51 * fVar49;
      }
      else {
        fVar63 = fVar57 * fVar66 + fVar38 * fVar59 * fVar41;
        fVar51 = fVar58 * fVar66 + fVar33 * fVar59 * fVar41;
      }
      fVar57 = (pAVar15->l).vx.field_0.m128[0] * fVar70 + (pAVar16->l).vx.field_0.m128[0] * fVar56;
      fVar58 = (pAVar15->l).vy.field_0.m128[0] * fVar70 + (pAVar16->l).vy.field_0.m128[0] * fVar56;
      fVar61 = (pAVar15->l).vy.field_0.m128[1] * fVar70 + (pAVar16->l).vy.field_0.m128[1] * fVar56;
      fVar62 = (pAVar15->l).vz.field_0.m128[0] * fVar70 + (pAVar16->l).vz.field_0.m128[0] * fVar56;
      fVar41 = (pAVar15->l).vz.field_0.m128[1] * fVar70 + (pAVar16->l).vz.field_0.m128[1] * fVar56;
      fVar59 = (pAVar15->l).vz.field_0.m128[2] * fVar70 + (pAVar16->l).vz.field_0.m128[2] * fVar56;
      fVar75 = fVar70 * (pAVar15->p).field_0.m128[0] + fVar56 * (pAVar16->p).field_0.m128[0];
      fVar71 = fVar70 * (pAVar15->p).field_0.m128[1] + fVar56 * (pAVar16->p).field_0.m128[1];
      fVar72 = fVar70 * (pAVar15->p).field_0.m128[2] + fVar56 * (pAVar16->p).field_0.m128[2];
      fVar67 = fVar55 * fVar63 + fVar50 * fVar51;
      fVar42 = fVar55 * fVar63 - fVar50 * fVar51;
      fVar33 = fVar50 * fVar50 - fVar55 * fVar55;
      fVar66 = fVar50 * fVar50 + fVar55 * fVar55 + -fVar63 * fVar63 + -fVar51 * fVar51;
      fVar73 = fVar63 * fVar63 + fVar33 + -fVar51 * fVar51;
      fVar76 = fVar55 * fVar51 - fVar50 * fVar63;
      fVar49 = fVar50 * fVar63 + fVar55 * fVar51;
      fVar74 = fVar63 * fVar51 + fVar50 * fVar55;
      fVar50 = fVar63 * fVar51 - fVar50 * fVar55;
      fVar67 = fVar67 + fVar67;
      fVar76 = fVar76 + fVar76;
      fVar55 = fVar51 * fVar51 + fVar33 + -fVar63 * fVar63;
      fVar33 = fVar66 * 1.0 + fVar67 * 0.0 + fVar76 * 0.0;
      fVar38 = fVar66 * 0.0 + fVar67 * 1.0 + fVar76 * 0.0;
      fVar66 = fVar66 * 0.0 + fVar67 * 0.0 + fVar76 * 1.0;
      fVar74 = fVar74 + fVar74;
      fVar42 = fVar42 + fVar42;
      fVar63 = fVar42 * 1.0 + fVar73 * 0.0 + fVar74 * 0.0;
      fVar51 = fVar42 * 0.0 + fVar73 * 1.0 + fVar74 * 0.0;
      fVar42 = fVar42 * 0.0 + fVar73 * 0.0 + fVar74 * 1.0;
      fVar49 = fVar49 + fVar49;
      fVar50 = fVar50 + fVar50;
      fVar67 = fVar49 * 1.0 + fVar50 * 0.0 + fVar55 * 0.0;
      fVar73 = fVar49 * 0.0 + fVar50 * 1.0 + fVar55 * 0.0;
      fVar49 = fVar49 * 0.0 + fVar50 * 0.0 + fVar55 * 1.0;
      fVar50 = fVar57 * fVar33 + fVar63 * 0.0 + fVar67 * 0.0;
      fVar55 = fVar57 * fVar38 + fVar51 * 0.0 + fVar73 * 0.0;
      fVar57 = fVar57 * fVar66 + fVar42 * 0.0 + fVar49 * 0.0;
      auVar39._0_4_ = fVar58 * fVar33 + fVar61 * fVar63 + fVar67 * 0.0;
      auVar39._4_4_ = fVar58 * fVar38 + fVar61 * fVar51 + fVar73 * 0.0;
      auVar39._8_4_ = fVar58 * fVar66 + fVar61 * fVar42 + fVar49 * 0.0;
      auVar68._0_4_ = fVar62 * fVar33 + fVar41 * fVar63 + fVar59 * fVar67;
      auVar68._4_4_ = fVar62 * fVar38 + fVar41 * fVar51 + fVar59 * fVar73;
      auVar68._8_4_ = fVar62 * fVar66 + fVar41 * fVar42 + fVar59 * fVar49;
      auVar60._0_4_ =
           fVar75 * fVar33 + fVar71 * fVar63 + fVar72 * fVar67 +
           (pAVar15->l).vx.field_0.m128[1] * fVar70 + (pAVar16->l).vx.field_0.m128[1] * fVar56 + 0.0
      ;
      auVar60._4_4_ =
           fVar75 * fVar38 + fVar71 * fVar51 + fVar72 * fVar73 +
           (pAVar15->l).vx.field_0.m128[2] * fVar70 + (pAVar16->l).vx.field_0.m128[2] * fVar56 + 0.0
      ;
      auVar60._8_4_ =
           fVar75 * fVar66 + fVar71 * fVar42 + fVar72 * fVar49 +
           (pAVar15->l).vy.field_0.m128[2] * fVar70 + (pAVar16->l).vy.field_0.m128[2] * fVar56 + 0.0
      ;
    }
    else {
      fVar58 = 1.0 - fVar56;
      fVar50 = (pAVar15->l).vx.field_0.m128[0] * fVar58 + (pAVar16->l).vx.field_0.m128[0] * fVar56;
      fVar55 = (pAVar15->l).vx.field_0.m128[1] * fVar58 + (pAVar16->l).vx.field_0.m128[1] * fVar56;
      fVar57 = (pAVar15->l).vx.field_0.m128[2] * fVar58 + (pAVar16->l).vx.field_0.m128[2] * fVar56;
      auVar39._0_4_ =
           (pAVar15->l).vy.field_0.m128[0] * fVar58 + (pAVar16->l).vy.field_0.m128[0] * fVar56;
      auVar39._4_4_ =
           (pAVar15->l).vy.field_0.m128[1] * fVar58 + (pAVar16->l).vy.field_0.m128[1] * fVar56;
      auVar39._8_4_ =
           (pAVar15->l).vy.field_0.m128[2] * fVar58 + (pAVar16->l).vy.field_0.m128[2] * fVar56;
      auVar68._0_4_ =
           (pAVar15->l).vz.field_0.m128[0] * fVar58 + (pAVar16->l).vz.field_0.m128[0] * fVar56;
      auVar68._4_4_ =
           (pAVar15->l).vz.field_0.m128[1] * fVar58 + (pAVar16->l).vz.field_0.m128[1] * fVar56;
      auVar68._8_4_ =
           (pAVar15->l).vz.field_0.m128[2] * fVar58 + (pAVar16->l).vz.field_0.m128[2] * fVar56;
      auVar60._0_4_ = fVar58 * (pAVar15->p).field_0.m128[0] + fVar56 * (pAVar16->p).field_0.m128[0];
      auVar60._4_4_ = fVar58 * (pAVar15->p).field_0.m128[1] + fVar56 * (pAVar16->p).field_0.m128[1];
      auVar60._8_4_ = fVar58 * (pAVar15->p).field_0.m128[2] + fVar56 * (pAVar16->p).field_0.m128[2];
    }
    fVar51 = auVar68._0_4_;
    fVar41 = auVar68._4_4_;
    fVar59 = auVar68._8_4_;
    fVar61 = auVar39._0_4_;
    fVar62 = auVar39._4_4_;
    fVar63 = auVar39._8_4_;
    auVar24._0_4_ = fVar61 * fVar41 - fVar62 * fVar51;
    fVar56 = fVar62 * fVar59 - fVar63 * fVar41;
    fVar58 = fVar63 * fVar51 - fVar61 * fVar59;
    auVar24._4_4_ = fVar51 * fVar55 - fVar41 * fVar50;
    auVar24._8_4_ = fVar50 * fVar62 - fVar55 * fVar61;
    auVar24._12_4_ = 0;
    auVar30._4_4_ = fVar41 * fVar57 - fVar59 * fVar55;
    auVar30._0_4_ = fVar56;
    auVar30._8_4_ = fVar55 * fVar63 - fVar57 * fVar62;
    auVar30._12_4_ = 0;
    auVar21._4_4_ = fVar59 * fVar50 - fVar51 * fVar57;
    auVar21._0_4_ = fVar58;
    auVar21._8_4_ = fVar57 * fVar61 - fVar50 * fVar63;
    auVar21._12_4_ = 0;
    fVar50 = fVar57 * auVar24._0_4_ + fVar55 * fVar58 + fVar50 * fVar56;
    auVar7._4_4_ = fVar50;
    auVar7._0_4_ = fVar50;
    auVar7._8_4_ = fVar50;
    auVar7._12_4_ = fVar50;
    auVar31 = divps(auVar30,auVar7);
    auVar8._4_4_ = fVar50;
    auVar8._0_4_ = fVar50;
    auVar8._8_4_ = fVar50;
    auVar8._12_4_ = fVar50;
    auVar32 = divps(auVar21,auVar8);
    auVar9._4_4_ = fVar50;
    auVar9._0_4_ = fVar50;
    auVar9._8_4_ = fVar50;
    auVar9._12_4_ = fVar50;
    auVar25 = divps(auVar24,auVar9);
    fVar57 = auVar60._0_4_;
    fVar58 = auVar60._4_4_;
    fVar61 = auVar60._8_4_;
    fVar50 = -(fVar57 * auVar31._0_4_ + fVar58 * auVar32._0_4_ + fVar61 * auVar25._0_4_);
    fVar55 = -(fVar57 * auVar31._4_4_ + fVar58 * auVar32._4_4_ + fVar61 * auVar25._4_4_);
    fVar56 = -(fVar57 * auVar31._8_4_ + fVar58 * auVar32._8_4_ + fVar61 * auVar25._8_4_);
    fVar57 = -(fVar57 * auVar31._12_4_ + fVar58 * auVar32._12_4_ + fVar61 * auVar25._12_4_);
  }
  local_80 = 2;
  bVar12 = true;
  local_68 = 0.0;
  fVar58 = auVar32._0_4_;
  fVar61 = auVar32._4_4_;
  fVar62 = auVar32._8_4_;
  fVar59 = auVar31._0_4_;
  fVar42 = auVar31._4_4_;
  fVar66 = auVar31._8_4_;
  fVar63 = auVar25._0_4_;
  fVar51 = auVar25._4_4_;
  fVar41 = auVar25._8_4_;
  if ((((context->query_type == POINT_QUERY_TYPE_SPHERE) &&
       (ABS(fVar62 * fVar66 + fVar61 * fVar42 + fVar58 * fVar59) <= 1e-05)) &&
      (ABS(fVar41 * fVar66 + fVar51 * fVar42 + fVar63 * fVar59) <= 1e-05)) &&
     (ABS(fVar41 * fVar62 + fVar51 * fVar61 + fVar63 * fVar58) <= 1e-05)) {
    fVar33 = fVar66 * fVar66 + fVar42 * fVar42 + fVar59 * fVar59;
    fVar38 = fVar62 * fVar62 + fVar61 * fVar61 + fVar58 * fVar58;
    if (((ABS(fVar33 - fVar38) <= 1e-05) &&
        (fVar49 = fVar41 * fVar41 + fVar51 * fVar51 + fVar63 * fVar63, ABS(fVar33 - fVar49) <= 1e-05
        )) && (ABS(fVar38 - fVar49) <= 1e-05)) {
      local_68 = SQRT(fVar33);
      local_80 = 1;
      bVar12 = false;
    }
  }
  pRVar6 = context->userContext;
  uVar14 = pRVar6->instStackSize;
  pRVar6->instID[uVar14] = prim->instID_;
  pRVar6->instPrimID[uVar14] = 0;
  *(undefined1 (*) [16])pRVar6->world2inst[uVar14] = auVar31;
  *(undefined1 (*) [16])(pRVar6->world2inst[uVar14] + 4) = auVar32;
  *(undefined1 (*) [16])(pRVar6->world2inst[uVar14] + 8) = auVar25;
  pfVar1 = pRVar6->world2inst[uVar14] + 0xc;
  *pfVar1 = fVar50;
  pfVar1[1] = fVar55;
  pfVar1[2] = fVar56;
  pfVar1[3] = fVar57;
  pafVar2 = pRVar6->inst2world + uVar14;
  (*pafVar2)[0] = fVar40;
  (*pafVar2)[1] = fVar45;
  (*pafVar2)[2] = fVar47;
  (*pafVar2)[3] = fVar23;
  pfVar1 = pRVar6->inst2world[uVar14] + 4;
  *pfVar1 = fVar35;
  pfVar1[1] = fVar36;
  pfVar1[2] = fVar37;
  pfVar1[3] = fVar48;
  pfVar1 = pRVar6->inst2world[uVar14] + 8;
  *pfVar1 = fVar27;
  pfVar1[1] = fVar28;
  pfVar1[2] = fVar29;
  pfVar1[3] = fVar34;
  pfVar1 = pRVar6->inst2world[uVar14] + 0xc;
  *pfVar1 = fVar17;
  pfVar1[1] = fVar18;
  pfVar1[2] = fVar20;
  pfVar1[3] = fVar19;
  pRVar6->instStackSize = pRVar6->instStackSize + 1;
  local_bc = query->time;
  fVar17 = (query->p).field_0.field_0.x;
  fVar18 = (query->p).field_0.field_0.y;
  fVar19 = (query->p).field_0.field_0.z;
  local_c0 = fVar17 * fVar66 + fVar18 * fVar62 + fVar19 * fVar41 + fVar56;
  local_c8 = CONCAT44(fVar17 * fVar42 + fVar18 * fVar61 + fVar19 * fVar51 + fVar55,
                      fVar17 * fVar59 + fVar18 * fVar58 + fVar19 * fVar63 + fVar50);
  local_b8 = query->radius * local_68;
  local_98 = *(long *)&(pIVar5->super_Geometry).field_0x58;
  local_88 = context->query_ws;
  local_78 = context->func;
  local_70 = context->userContext;
  local_60 = context->userPtr;
  local_90 = 0;
  local_58 = 0xffffffffffffffff;
  local_48 = local_88->radius;
  if (bVar12) {
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    if ((local_48 < INFINITY) && (local_70->instStackSize != 0)) {
      uVar14 = local_70->instStackSize - 1;
      pafVar2 = local_70->world2inst + uVar14;
      pfVar1 = local_70->world2inst[uVar14] + 4;
      pfVar3 = local_70->world2inst[uVar14] + 8;
      pfVar4 = local_70->world2inst[uVar14] + 0xc;
      fVar23 = *pfVar4 - *pfVar3 * local_48;
      fVar27 = pfVar4[1] - pfVar3[1] * local_48;
      fVar28 = pfVar4[2] - pfVar3[2] * local_48;
      fVar29 = pfVar4[3] - pfVar3[3] * local_48;
      fVar34 = -local_48 * *pfVar1;
      fVar35 = -local_48 * pfVar1[1];
      fVar36 = -local_48 * pfVar1[2];
      fVar37 = -local_48 * pfVar1[3];
      fVar50 = fVar34 + fVar23;
      fVar55 = fVar35 + fVar27;
      fVar56 = fVar36 + fVar28;
      fVar57 = fVar37 + fVar29;
      fVar40 = -local_48 * (*pafVar2)[0];
      fVar45 = -local_48 * (*pafVar2)[1];
      fVar47 = -local_48 * (*pafVar2)[2];
      fVar48 = -local_48 * (*pafVar2)[3];
      auVar69._0_4_ = fVar40 + fVar50;
      auVar69._4_4_ = fVar45 + fVar55;
      auVar69._8_4_ = fVar47 + fVar56;
      auVar69._12_4_ = fVar48 + fVar57;
      auVar31 = minps(_DAT_01f7a9f0,auVar69);
      auVar32 = maxps(_DAT_01f7aa00,auVar69);
      fVar58 = *pfVar3 * local_48 + *pfVar4;
      fVar61 = pfVar3[1] * local_48 + pfVar4[1];
      fVar62 = pfVar3[2] * local_48 + pfVar4[2];
      fVar63 = pfVar3[3] * local_48 + pfVar4[3];
      fVar34 = fVar34 + fVar58;
      fVar35 = fVar35 + fVar61;
      fVar36 = fVar36 + fVar62;
      fVar37 = fVar37 + fVar63;
      auVar64._0_4_ = fVar40 + fVar34;
      auVar64._4_4_ = fVar45 + fVar35;
      auVar64._8_4_ = fVar47 + fVar36;
      auVar64._12_4_ = fVar48 + fVar37;
      auVar31 = minps(auVar31,auVar64);
      auVar32 = maxps(auVar32,auVar64);
      fVar17 = *pfVar1 * local_48;
      fVar18 = pfVar1[1] * local_48;
      fVar19 = pfVar1[2] * local_48;
      fVar20 = pfVar1[3] * local_48;
      fVar23 = fVar23 + fVar17;
      fVar27 = fVar27 + fVar18;
      fVar28 = fVar28 + fVar19;
      fVar29 = fVar29 + fVar20;
      auVar65._0_4_ = fVar40 + fVar23;
      auVar65._4_4_ = fVar45 + fVar27;
      auVar65._8_4_ = fVar47 + fVar28;
      auVar65._12_4_ = fVar48 + fVar29;
      auVar31 = minps(auVar31,auVar65);
      auVar32 = maxps(auVar32,auVar65);
      fVar17 = fVar17 + fVar58;
      fVar18 = fVar18 + fVar61;
      fVar19 = fVar19 + fVar62;
      fVar20 = fVar20 + fVar63;
      auVar43._0_4_ = fVar40 + fVar17;
      auVar43._4_4_ = fVar45 + fVar18;
      auVar43._8_4_ = fVar47 + fVar19;
      auVar43._12_4_ = fVar48 + fVar20;
      auVar31 = minps(auVar31,auVar43);
      auVar32 = maxps(auVar32,auVar43);
      fVar40 = local_48 * (*pafVar2)[0];
      fVar45 = local_48 * (*pafVar2)[1];
      fVar47 = local_48 * (*pafVar2)[2];
      local_48 = local_48 * (*pafVar2)[3];
      auVar52._0_4_ = fVar50 + fVar40;
      auVar52._4_4_ = fVar55 + fVar45;
      auVar52._8_4_ = fVar56 + fVar47;
      auVar52._12_4_ = fVar57 + local_48;
      auVar31 = minps(auVar31,auVar52);
      auVar32 = maxps(auVar32,auVar52);
      fVar34 = fVar34 + fVar40;
      fVar35 = fVar35 + fVar45;
      fVar36 = fVar36 + fVar47;
      fVar37 = fVar37 + local_48;
      auVar10._4_4_ = fVar35;
      auVar10._0_4_ = fVar34;
      auVar10._8_4_ = fVar36;
      auVar10._12_4_ = fVar37;
      auVar31 = minps(auVar31,auVar10);
      auVar11._4_4_ = fVar35;
      auVar11._0_4_ = fVar34;
      auVar11._8_4_ = fVar36;
      auVar11._12_4_ = fVar37;
      auVar32 = maxps(auVar32,auVar11);
      auVar26._0_4_ = fVar23 + fVar40;
      auVar26._4_4_ = fVar27 + fVar45;
      auVar26._8_4_ = fVar28 + fVar47;
      auVar26._12_4_ = fVar29 + local_48;
      auVar31 = minps(auVar31,auVar26);
      auVar32 = maxps(auVar32,auVar26);
      auVar22._0_4_ = fVar40 + fVar17;
      auVar22._4_4_ = fVar45 + fVar18;
      auVar22._8_4_ = fVar47 + fVar19;
      auVar22._12_4_ = local_48 + fVar20;
      auVar31 = minps(auVar31,auVar22);
      auVar32 = maxps(auVar32,auVar22);
      local_48 = (auVar32._0_4_ - auVar31._0_4_) * 0.5;
      fStack_44 = (auVar32._4_4_ - auVar31._4_4_) * 0.5;
      fStack_40 = (auVar32._8_4_ - auVar31._8_4_) * 0.5;
      fStack_3c = (auVar32._12_4_ - auVar31._12_4_) * 0.5;
    }
  }
  else {
    local_48 = local_68 * local_48;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
  }
  uVar13 = (**(code **)(local_98 + 0x88))(local_98 + 0x58,&local_c8);
  pRVar6 = context->userContext;
  uVar14 = pRVar6->instStackSize - 1;
  pRVar6->instStackSize = uVar14;
  pRVar6->instID[uVar14] = 0xffffffff;
  pRVar6->instPrimID[pRVar6->instStackSize] = 0xffffffff;
  return (bool)uVar13;
}

Assistant:

bool InstanceIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World(query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;
        
        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }